

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::PopTableBackground(void)

{
  ImGuiTableColumn *pIVar1;
  ImGuiTableColumn *column;
  ImGuiTable *table;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiTable *draw_list;
  ImGuiWindow *window_00;
  
  window_00 = GImGui->CurrentWindow;
  draw_list = GImGui->CurrentTable;
  pIVar1 = ImSpan<ImGuiTableColumn>::operator[]
                     ((ImSpan<ImGuiTableColumn> *)window_00,(int)((ulong)draw_list >> 0x20));
  SetWindowClipRectBeforeSetChannel(window_00,(ImRect *)draw_list);
  ImDrawListSplitter::SetCurrentChannel
            ((ImDrawListSplitter *)window_00,(ImDrawList *)draw_list,(int)((ulong)pIVar1 >> 0x20));
  return;
}

Assistant:

void    ImGui::PopTableBackground()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiTable* table = g.CurrentTable;
    ImGuiTableColumn* column = &table->Columns[table->CurrentColumn];

    // Optimization: avoid PopClipRect() + SetCurrentChannel()
    SetWindowClipRectBeforeSetChannel(window, table->HostBackupClipRect);
    table->DrawSplitter.SetCurrentChannel(window->DrawList, column->DrawChannelCurrent);
}